

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O1

int64_t motion_mode_rd(AV1_COMP *cpi,TileDataEnc *tile_data,MACROBLOCK *x,BLOCK_SIZE bsize,
                      RD_STATS *rd_stats,RD_STATS *rd_stats_y,RD_STATS *rd_stats_uv,
                      HandleInterModeArgs *args,int64_t ref_best_rd,int64_t *ref_skip_rd,
                      int *rate_mv,BUFFER_SET *orig_dst,int64_t *best_est_rd,int do_tx_search,
                      InterModesInfo *inter_modes_info,int eval_motion_mode,int64_t *yrd)

{
  RD_STATS *pRVar1;
  int64_t *piVar2;
  uint8_t uVar3;
  char cVar4;
  char cVar5;
  InterpFilter interp_filter;
  MOTION_MODE MVar6;
  BLOCK_SIZE BVar7;
  uint32_t uVar8;
  int iVar9;
  AV1_COMP *mbmi;
  MB_MODE_INFO *pMVar10;
  long lVar11;
  scale_factors *psVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  int64_t iVar18;
  macroblockd_plane *pmVar19;
  int iVar20;
  undefined7 uVar21;
  TileDataEnc *pTVar22;
  WarpedMotionParams *pWVar23;
  byte bVar24;
  uint8_t uVar25;
  uint uVar26;
  int_mv iVar27;
  int_mv iVar28;
  ulong uVar29;
  int64_t iVar30;
  long lVar31;
  uint uVar32;
  int iVar33;
  uint uVar34;
  int (*paiVar35) [3];
  ulong uVar36;
  buf_2d *pbVar37;
  long lVar38;
  AV1_COMP *cpi_00;
  byte bVar39;
  byte bVar40;
  long lVar41;
  long lVar42;
  WARP_SAMPLE_INFO *pWVar43;
  size_t sVar44;
  long lVar45;
  bool bVar46;
  bool bVar47;
  double dVar48;
  int tmp_rate_mv;
  ulong local_cf0;
  int local_ce8;
  int tmp_rate2;
  double local_ce0;
  MACROBLOCKD *local_cd8;
  RD_STATS *local_cd0;
  uint local_cc4;
  int local_cc0;
  uint local_cbc;
  long local_cb8;
  double local_cb0;
  long local_ca8;
  AV1_COMP *local_ca0;
  int_mv *local_c98;
  ulong local_c90;
  int local_c88;
  int_interpfilters local_c84;
  int local_c80;
  uint local_c7c;
  int local_c78;
  int_mv ref_mv;
  TileDataEnc *local_c70;
  long local_c68;
  undefined4 local_c60;
  undefined3 uStack_c5c;
  int64_t local_c58;
  undefined8 local_c50;
  int64_t local_c48;
  ulong local_c40;
  ulong local_c38;
  int *local_c30;
  int *local_c28;
  ulong local_c20;
  int local_c14;
  InterModeRdModel *md;
  WarpedMotionParams *local_c08;
  ulong local_c00;
  ulong local_bf8;
  ulong local_bf0;
  WarpedMotionParams wm_params0;
  int64_t local_bb8;
  int64_t iStack_bb0;
  RD_STATS best_rd_stats_uv;
  RD_STATS best_rd_stats_y;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int pts_inref [16];
  int pts [16];
  MB_MODE_INFO best_mbmi;
  MB_MODE_INFO base_mbmi;
  uint8_t best_tx_type_map [1024];
  uint8_t best_blk_skip [1024];
  
  uVar3 = ((cpi->common).seq_params)->monochrome;
  mbmi = (AV1_COMP *)*(x->e_mbd).mi;
  cVar4 = *(MV_REFERENCE_FRAME *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1);
  bVar24 = *(PREDICTION_MODE *)((long)&mbmi->ppi + 2);
  local_cf0 = (ulong)bVar24;
  if (((cpi->common).seq_params)->enable_interintra_compound == '\0') {
LAB_00216fad:
    bVar40 = 0;
  }
  else {
    bVar40 = 0;
    if ((0xf8 < (byte)(*(BLOCK_SIZE *)&mbmi->ppi - BLOCK_32X64)) &&
       (bVar40 = 0, 0xfb < (byte)(bVar24 - 0x11))) {
      if ('\0' < cVar4 || (char)(mbmi->enc_quant_dequant_params).quants.y_quant[0][0] < '\x01')
      goto LAB_00216fad;
      bVar40 = ((byte)(mbmi->enc_quant_dequant_params).quants.y_quant[9][4] & 2) >> 1;
    }
  }
  local_c78 = rd_stats->rate;
  local_ce8 = *rate_mv;
  cVar5 = (char)(mbmi->enc_quant_dequant_params).quants.y_quant[0][0];
  *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) = '\x01';
  *yrd = 0x7fffffffffffffff;
  bVar47 = false;
  uVar26 = 0;
  if ((cpi->common).features.switchable_motion_mode != true) goto LAB_002170a4;
  if ((uint8_t)(mbmi->enc_quant_dequant_params).quants.y_quant[0][5] == '\0') {
LAB_002170a1:
    bVar47 = false;
    uVar26 = 0;
  }
  else {
    iVar33 = (x->e_mbd).cur_frame_force_integer_mv;
    if (iVar33 == 0) {
      bVar39 = block_size_high[*(BLOCK_SIZE *)&mbmi->ppi];
      if (block_size_wide[*(BLOCK_SIZE *)&mbmi->ppi] < block_size_high[*(BLOCK_SIZE *)&mbmi->ppi]) {
        bVar39 = block_size_wide[*(BLOCK_SIZE *)&mbmi->ppi];
      }
      if (((bVar24 == 0xf || bVar24 == 0x17) &&
          (1 < (x->e_mbd).global_motion[(char)(mbmi->enc_quant_dequant_params).quants.y_quant[0][0]]
               .wmtype)) && (bVar47 = false, 7 < bVar39)) goto LAB_002170a4;
    }
    bVar39 = block_size_high[*(BLOCK_SIZE *)&mbmi->ppi];
    if (block_size_wide[*(BLOCK_SIZE *)&mbmi->ppi] < block_size_high[*(BLOCK_SIZE *)&mbmi->ppi]) {
      bVar39 = block_size_wide[*(BLOCK_SIZE *)&mbmi->ppi];
    }
    bVar47 = false;
    if (bVar39 < 8) goto LAB_002170a1;
    if ((0xf3 < (byte)(bVar24 - 0x19)) &&
       (bVar47 = false,
       *(MV_REFERENCE_FRAME *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) < '\0')
       ) {
      if ((cpi->common).features.allow_warped_motion != false && iVar33 == 0) {
        psVar12 = (x->e_mbd).block_ref_scale_factors[0];
        iVar33 = psVar12->x_scale_fp;
        uVar26 = 2;
        bVar47 = true;
        if (((iVar33 == -1) || (iVar9 = psVar12->y_scale_fp, iVar9 == -1)) ||
           (iVar9 == 0x4000 && iVar33 == 0x4000)) goto LAB_002170a4;
      }
      uVar26 = 1;
      bVar47 = false;
    }
  }
LAB_002170a4:
  local_ca0 = (AV1_COMP *)&cpi->common;
  local_cd8 = &x->e_mbd;
  local_c28 = x->warp_sample_info[cVar5].pts;
  local_c30 = x->warp_sample_info[cVar5].pts_inref;
  local_cd0 = rd_stats_y;
  local_c70 = tile_data;
  if (bVar47) {
    pWVar43 = x->warp_sample_info + cVar5;
    if (pWVar43->num < 0) {
      bVar24 = av1_findSamples((AV1_COMMON *)local_ca0,local_cd8,local_c28,local_c30);
      pWVar43->num = (uint)bVar24;
    }
    *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) =
         (uint8_t)pWVar43->num;
  }
  local_bf0 = (ulong)bVar40;
  bVar24 = *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9);
  local_bf8 = (ulong)bVar24;
  local_cbc = 1;
  if (bVar24 != 0) {
    local_cbc = uVar26;
  }
  memcpy(&base_mbmi,mbmi,0xb0);
  pTVar22 = local_c70;
  interp_filter = (cpi->common).features.interp_filter;
  pMVar10 = *(x->e_mbd).mi;
  local_cc0 = 0;
  if (((pMVar10->field_0xa7 & 0x40) == 0) && (pMVar10->motion_mode != '\x02')) {
    if ((pMVar10->mode == '\x17') || (pMVar10->mode == '\x0f')) {
      bVar24 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [pMVar10->bsize];
      if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
          [pMVar10->bsize] <
          "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
          [pMVar10->bsize]) {
        bVar24 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar10->bsize];
      }
      if (1 < bVar24) {
        lVar45 = 0;
        do {
          if ((x->e_mbd).global_motion[pMVar10->ref_frame[lVar45]].wmtype == '\x01')
          goto LAB_002171f3;
          local_cc0 = 0;
        } while (('\0' < pMVar10->ref_frame[1]) &&
                (bVar47 = lVar45 == 0, lVar45 = lVar45 + 1, bVar47));
        goto LAB_00217228;
      }
    }
LAB_002171f3:
    local_cc0 = 0;
    local_cc0 = av1_get_switchable_rate
                          (x,local_cd8,interp_filter,
                           (uint)((cpi->common).seq_params)->enable_dual_filter);
  }
LAB_00217228:
  local_c20 = (ulong)(byte)local_cbc;
  uVar32 = (local_cbc & 0xff) + (int)local_bf0;
  uVar26 = uVar32;
  uVar36 = 0;
  if (eval_motion_mode == 0) {
    uVar26 = 0;
    uVar36 = (ulong)((uint)(0xc3fe00L >> (bsize & 0x3f)) & 4);
  }
  bVar47 = (cpi->sf).winner_mode_sf.motion_mode_for_winner_cand != 0;
  if (!bVar47) {
    uVar26 = uVar32;
  }
  bVar47 = bVar47 && eval_motion_mode != 0;
  if (((cpi->sf).inter_sf.extra_prune_warped != 0) && (BLOCK_16X16 < *(BLOCK_SIZE *)&mbmi->ppi)) {
    uVar26 = 0;
  }
  local_c90 = 0;
  iVar33 = (uint)(uVar3 == '\0') * 2;
  local_c00 = (ulong)(iVar33 + 1);
  uVar32 = (uint)bVar47;
  bVar46 = (int)uVar26 < (int)uVar32;
  local_c7c = uVar26;
  if ((int)uVar26 < (int)uVar32) {
    local_bb8 = 0x7fffffffffffffff;
    iStack_bb0 = 0x7fffffffffffffff;
    bVar47 = true;
    local_ca8 = CONCAT44(local_ca8._4_4_,0x7fffffff);
    local_c50 = 0;
    local_c48 = 0x7fffffffffffffff;
    local_cc4 = 0;
  }
  else {
    local_c68 = ref_best_rd;
    local_c38 = (ulong)(uint)(x->e_mbd).mi_row;
    local_c40 = (ulong)(uint)(x->e_mbd).mi_col;
    local_cb8 = (long)*(int *)((long)(cpi->sf).inter_sf.txfm_rd_gate_level + uVar36);
    uVar32 = (uint)interp_filter;
    if (interp_filter == MULTITAP_SHARP2) {
      uVar32 = 0;
    }
    local_c84.as_int = uVar32 << 0x10 | uVar32;
    local_c88 = local_c78 - local_ce8;
    md = pTVar22->inter_mode_rd_models + bsize;
    local_c70 = (TileDataEnc *)pTVar22->inter_mode_rd_models;
    local_bb8 = 0x7fffffffffffffff;
    iStack_bb0 = 0x7fffffffffffffff;
    local_c08 = (WarpedMotionParams *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 6);
    uVar36 = (ulong)(uint)((int)local_bf8 * 8);
    local_c98 = (int_mv *)&mbmi->field_0x8;
    local_cc4 = 0;
    lVar45 = 0x7fffffffffffffff;
    local_c80 = local_ce8;
    local_ca8 = CONCAT44(local_ca8._4_4_,0x7fffffff);
    local_c90 = 0;
    local_c48 = 0x7fffffffffffffff;
    local_c50 = 0;
    uVar32 = (uint)bVar47;
    local_c14 = iVar33;
    do {
      if ((uVar32 == 0) || (args->skip_motion_mode == 0)) {
        tmp_rate2 = local_c78;
        tmp_rate_mv = local_ce8;
        cpi_00 = mbmi;
        memcpy(mbmi,&base_mbmi,0xb0);
        if ((uint)local_c20 < uVar32) {
          *(MOTION_MODE *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 4) = '\0';
        }
        else {
          *(MOTION_MODE *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 4) =
               (MOTION_MODE)uVar32;
        }
        if ((((cpi->oxcf).motion_mode_cfg.enable_obmc == true) &&
            ((cpi->sf).inter_sf.prune_obmc_prob_thresh <=
             (cpi->ppi->frame_probs).obmc_probs
             [(cpi->ppi->gf_group).update_type[cpi->gf_frame_index]][bsize])) ||
           (bVar24 = 0, (MOTION_MODE)(mbmi->enc_quant_dequant_params).quants.y_quant[0][4] != '\x01'
           )) {
          MVar6 = (MOTION_MODE)(mbmi->enc_quant_dequant_params).quants.y_quant[0][4];
          if (((uint)local_c20 < uVar32) || (MVar6 != '\0')) {
            if (MVar6 == '\x02') {
              *(MOTION_MODE *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 4) = '\x02';
              *(TransformationType *)((mbmi->enc_quant_dequant_params).quants.y_quant[2] + 6) =
                   '\x03';
              ((int_interpfilters *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 2))->
              as_int = (uint32_t)local_c84;
              memcpy(pts,local_c28,uVar36);
              memcpy(pts_inref,local_c30,uVar36);
              uVar26 = (uint)*(uint8_t *)
                              ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9);
              if (1 < uVar26) {
                uVar25 = av1_selectSamples(&local_c98->as_mv,pts,pts_inref,uVar26,bsize);
                *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) = uVar25;
              }
              pWVar23 = local_c08;
              bVar24 = *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9);
              cpi_00 = (AV1_COMP *)(ulong)bVar24;
              iVar33 = av1_find_projection((uint)bVar24,pts,pts_inref,bsize,
                                           (int)(((int_mv *)&mbmi->field_0x8)->as_mv).row,
                                           (int)*(short *)&mbmi->field_0xa,local_c08,(int)local_c38,
                                           (int)local_c40);
              if (iVar33 == 0) {
                local_ce0 = (double)((ulong)local_ce0 & 0xffffffff00000000);
                if (((byte)local_cf0 < 0x19) && ((0x1790000U >> ((uint)local_cf0 & 0x1f) & 1) != 0))
                {
                  local_cb0 = (double)CONCAT44(local_cb0._4_4_,((int_mv *)&mbmi->field_0x8)->as_int)
                  ;
                  wm_params0.wmtype = pWVar23->wmtype;
                  wm_params0.invalid = pWVar23->invalid;
                  wm_params0._34_2_ = *(undefined2 *)&pWVar23->field_0x22;
                  wm_params0.wmmat._0_8_ = *(undefined8 *)pWVar23->wmmat;
                  wm_params0.wmmat._8_8_ = *(undefined8 *)(pWVar23->wmmat + 2);
                  wm_params0.wmmat._16_8_ = *(undefined8 *)(pWVar23->wmmat + 4);
                  wm_params0.alpha = pWVar23->alpha;
                  wm_params0.beta = pWVar23->beta;
                  wm_params0.gamma = pWVar23->gamma;
                  wm_params0.delta = pWVar23->delta;
                  local_c58 = CONCAT71(local_c58._1_7_,
                                       *(uint8_t *)
                                        ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] +
                                        9));
                  ref_mv = av1_get_ref_mv(x,0);
                  av1_make_default_subpel_ms_params(&ms_params,cpi,x,bsize,&ref_mv.as_mv,(int *)0x0)
                  ;
                  av1_refine_warped_mv
                            (local_cd8,(AV1_COMMON *)local_ca0,&ms_params,bsize,local_c28,local_c30,
                             (int)local_bf8,(cpi->sf).mv_sf.warp_search_method,
                             (cpi->sf).mv_sf.warp_search_iters);
                  if (local_cb0._0_4_ == ((int_mv *)&mbmi->field_0x8)->as_int) {
                    ((int_mv *)&mbmi->field_0x8)->as_int = local_cb0._0_4_;
                    local_c08->wmtype = wm_params0.wmtype;
                    local_c08->invalid = wm_params0.invalid;
                    *(undefined2 *)&local_c08->field_0x22 = wm_params0._34_2_;
                    *(undefined8 *)(local_c08->wmmat + 4) = wm_params0.wmmat._16_8_;
                    local_c08->alpha = wm_params0.alpha;
                    local_c08->beta = wm_params0.beta;
                    local_c08->gamma = wm_params0.gamma;
                    local_c08->delta = wm_params0.delta;
                    *(undefined8 *)local_c08->wmmat = wm_params0.wmmat._0_8_;
                    *(undefined8 *)(local_c08->wmmat + 2) = wm_params0.wmmat._8_8_;
                    *(uint8_t *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 9) =
                         (uint8_t)local_c58;
                  }
                  else {
                    tmp_rate_mv = av1_mv_bit_cost((MV *)local_c98,&ref_mv.as_mv,
                                                  x->mv_costs->nmv_joint_cost,
                                                  x->mv_costs->mv_cost_stack,0x6c);
                    tmp_rate2 = tmp_rate_mv + local_c88;
                  }
                }
                cpi_00 = local_ca0;
                av1_enc_build_inter_predictor
                          ((AV1_COMMON *)local_ca0,local_cd8,(int)local_c38,(int)local_c40,
                           (BUFFER_SET *)0x0,bsize,0,
                           (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
                iVar33 = local_ce0._0_4_;
              }
              bVar24 = 0;
              if (iVar33 != 0) goto LAB_002183a0;
            }
            else if (MVar6 == '\x01') {
              uVar8 = local_c98->as_int;
              if (((uint)local_cf0 < 0x19) && ((0x1790000U >> ((uint)local_cf0 & 0x1f) & 1) != 0)) {
                av1_single_motion_search
                          (cpi,x,bsize,0,&tmp_rate_mv,0x7fffffff,(inter_mode_info *)0x0,local_c98,
                           (HandleInterModeArgs *)0x0);
                tmp_rate2 = tmp_rate_mv + local_c88;
              }
              if ((eval_motion_mode != 0) || (local_c98->as_int != uVar8)) {
                av1_enc_build_inter_predictor
                          ((AV1_COMMON *)local_ca0,local_cd8,(int)local_c38,(int)local_c40,orig_dst,
                           bsize,0,(uint)(((cpi->common).seq_params)->monochrome == '\0') * 2);
              }
              cpi_00 = local_ca0;
              av1_build_obmc_inter_prediction
                        ((AV1_COMMON *)local_ca0,local_cd8,args->above_pred_buf,
                         args->above_pred_stride,args->left_pred_buf,args->left_pred_stride);
            }
            else if (((uint)local_c20 < uVar32) &&
                    (cpi_00 = cpi,
                    iVar33 = av1_handle_inter_intra_mode
                                       (cpi,x,bsize,(MB_MODE_INFO *)mbmi,args,local_c68,&tmp_rate_mv
                                        ,&tmp_rate2,orig_dst), iVar33 < 0)) {
              bVar24 = 0;
              goto LAB_002183a0;
            }
          }
          pMVar10 = *(x->e_mbd).mi;
          bVar24 = pMVar10->mode;
          if ((bVar24 == 0x13) || (bVar24 == 0x15)) {
            cpi_00 = (AV1_COMP *)x;
            iVar28 = av1_get_ref_mv(x,1);
            bVar24 = 0;
            if (pMVar10->mv[1].as_int != iVar28.as_int) goto LAB_00217abd;
          }
          else {
            if (bVar24 == 0x18) {
              iVar28 = av1_get_ref_mv(x,0);
              cpi_00 = (AV1_COMP *)x;
              iVar27 = av1_get_ref_mv(x,1);
              bVar24 = 0;
              if (pMVar10->mv[0].as_int != iVar28.as_int) {
                if (pMVar10->mv[1].as_int == iVar27.as_int) goto LAB_002183a0;
                goto LAB_00217abd;
              }
            }
            else {
              if (((bVar24 & 0xfd) == 0x14) || (bVar24 == 0x10)) {
                cpi_00 = (AV1_COMP *)x;
                iVar28 = av1_get_ref_mv(x,0);
                bVar24 = 0;
                if (pMVar10->mv[0].as_int == iVar28.as_int) goto LAB_002183a0;
              }
LAB_00217abd:
              (x->txfm_search_info).skip_txfm = '\0';
              rd_stats->dist = 0;
              rd_stats->sse = 0;
              rd_stats->skip_txfm = '\x01';
              rd_stats->rate = tmp_rate2;
              uVar29 = (ulong)(byte)(mbmi->enc_quant_dequant_params).quants.y_quant[0][4];
              if (uVar29 != 2) {
                rd_stats->rate = tmp_rate2 + local_cc0;
              }
              if ((int)local_bf0 != 0) {
                rd_stats->rate =
                     rd_stats->rate +
                     (x->mode_costs).interintra_cost[""[bsize]]
                     [*(MV_REFERENCE_FRAME *)
                       ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) == '\0'];
              }
              if (((byte)local_cbc != '\0') &&
                 (*(MV_REFERENCE_FRAME *)
                   ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) != '\0')) {
                paiVar35 = (x->mode_costs).motion_mode_cost + bsize;
                if ((byte)local_cbc != '\x02') {
                  paiVar35 = (int (*) [3])((x->mode_costs).motion_mode_cost1 + bsize);
                }
                rd_stats->rate = rd_stats->rate + (*paiVar35)[uVar29];
              }
              if (do_tx_search == 0) {
                ms_params.allow_hp = -1;
                ms_params._4_4_ = 0xffffffff;
                pts[0] = -1;
                pts[1] = -1;
                wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
                pts_inref[0] = 0;
                pts_inref[1] = 0;
                iVar33 = (cpi->sf).inter_sf.inter_mode_rd_model_estimation;
                if (iVar33 == 2) {
LAB_00217db1:
                  model_rd_for_sb_with_curvfit
                            (cpi_00,bsize,x,local_cd8,0,local_c14,wm_params0.wmmat,
                             (int64_t *)pts_inref,(uint8_t *)0x0,(int64_t *)&ms_params,(int *)0x0,
                             (int64_t *)0x0,(int64_t *)0x0);
                  pts[0] = (int)(ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]];
                  pts[1] = (int)((ulong)x->pred_sse[(*(x->e_mbd).mi)->ref_frame[0]] >> 0x20);
                }
                else if (iVar33 == 1) {
                  iVar30 = get_sse(cpi,x,(int64_t *)pts);
                  ms_params._0_8_ = iVar30;
                  if (md->ready != 0) {
                    dVar48 = md->dist_mean;
                    if (dVar48 <= (double)iVar30) {
                      local_ce0 = (double)iVar30;
                      local_cb0 = dVar48;
                      dVar48 = round(dVar48);
                      pts_inref[0] = (int)(long)dVar48;
                      pts_inref[1] = (int)((ulong)(long)dVar48 >> 0x20);
                      dVar48 = md->a * local_ce0 + md->b;
                      lVar41 = 0x3fffffff;
                      if (0.01 <= ABS(dVar48)) {
                        dVar48 = (local_ce0 - local_cb0) / dVar48;
                        lVar41 = 0;
                        if (0.0 <= dVar48) {
                          dVar48 = round(dVar48);
                          lVar41 = (long)dVar48;
                          if (0x3ffffffe < lVar41) {
                            lVar41 = 0x3fffffff;
                          }
                        }
                      }
                      wm_params0.wmmat[0] = (int)lVar41;
                      if (0 < (int)lVar41) goto LAB_00217e33;
                    }
                    wm_params0.wmmat._0_8_ = wm_params0.wmmat._0_8_ & 0xffffffff00000000;
                    pts_inref[0] = (int)iVar30;
                    pts_inref[1] = (int)((ulong)iVar30 >> 0x20);
                  }
                }
                else if ((cpi->sf).rt_sf.use_nonrd_pick_mode != 0) goto LAB_00217db1;
LAB_00217e33:
                iVar33 = rd_stats->rate;
                lVar41 = (long)wm_params0.wmmat[0] + (long)iVar33;
                iVar9 = x->rdmult;
                lVar42 = pts_inref._0_8_ * 0x80 + (lVar41 * iVar9 + 0x100 >> 9);
                dVar48 = (double)lVar42 * 0.8;
                dVar15 = (double)*best_est_rd;
                if (dVar15 < dVar48) {
                  *(char *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) = cVar4;
                }
                else {
                  rd_stats->rate = (int)lVar41;
                  rd_stats->dist = pts_inref._0_8_;
                  rd_stats->rdcost = lVar42;
                  if (lVar42 < *best_est_rd) {
                    *best_est_rd = lVar42;
                    lVar41 = 0x7fffffffffffffff;
                    if ((int)local_cb8 != 0) {
                      lVar41 = pts._0_8_ * 0x800 + ((long)iVar9 * (long)iVar33 + 0x100 >> 9);
                    }
                    ref_skip_rd[1] = lVar41;
                  }
                  if (((cpi->common).current_frame.reference_mode != '\0') || (cVar4 < '\x01')) {
                    local_c58 = ms_params._0_8_;
                    iVar30 = rd_stats->rdcost;
                    iVar9 = inter_modes_info->num;
                    local_ce0 = dVar48;
                    local_cb0 = dVar15;
                    memcpy(inter_modes_info->mbmi_arr + iVar9,mbmi,0xb0);
                    inter_modes_info->mode_rate_arr[iVar9] = iVar33;
                    inter_modes_info->sse_arr[iVar9] = local_c58;
                    inter_modes_info->est_rd_arr[iVar9] = iVar30;
                    iVar33 = rd_stats->rate;
                    iVar20 = rd_stats->zero_rate;
                    iVar30 = rd_stats->dist;
                    iVar18 = rd_stats->sse;
                    piVar2 = &inter_modes_info->rd_cost_arr[iVar9].rdcost;
                    *piVar2 = rd_stats->rdcost;
                    piVar2[1] = iVar18;
                    pRVar1 = inter_modes_info->rd_cost_arr + iVar9;
                    pRVar1->rate = iVar33;
                    pRVar1->zero_rate = iVar20;
                    pRVar1->dist = iVar30;
                    uVar21 = *(undefined7 *)&rd_stats->field_0x21;
                    inter_modes_info->rd_cost_arr[iVar9].skip_txfm = rd_stats->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_arr[iVar9].field_0x21 = uVar21;
                    uVar21 = *(undefined7 *)&local_cd0->field_0x21;
                    inter_modes_info->rd_cost_y_arr[iVar9].skip_txfm = local_cd0->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_y_arr[iVar9].field_0x21 = uVar21;
                    iVar33 = local_cd0->rate;
                    iVar20 = local_cd0->zero_rate;
                    iVar30 = local_cd0->dist;
                    iVar18 = local_cd0->sse;
                    piVar2 = &inter_modes_info->rd_cost_y_arr[iVar9].rdcost;
                    *piVar2 = local_cd0->rdcost;
                    piVar2[1] = iVar18;
                    pRVar1 = inter_modes_info->rd_cost_y_arr + iVar9;
                    pRVar1->rate = iVar33;
                    pRVar1->zero_rate = iVar20;
                    pRVar1->dist = iVar30;
                    iVar33 = rd_stats_uv->rate;
                    iVar20 = rd_stats_uv->zero_rate;
                    iVar30 = rd_stats_uv->dist;
                    iVar18 = rd_stats_uv->sse;
                    piVar2 = &inter_modes_info->rd_cost_uv_arr[iVar9].rdcost;
                    *piVar2 = rd_stats_uv->rdcost;
                    piVar2[1] = iVar18;
                    uVar21 = *(undefined7 *)&rd_stats_uv->field_0x21;
                    inter_modes_info->rd_cost_uv_arr[iVar9].skip_txfm = rd_stats_uv->skip_txfm;
                    *(undefined7 *)&inter_modes_info->rd_cost_uv_arr[iVar9].field_0x21 = uVar21;
                    pRVar1 = inter_modes_info->rd_cost_uv_arr + iVar9;
                    pRVar1->rate = iVar33;
                    pRVar1->zero_rate = iVar20;
                    pRVar1->dist = iVar30;
                    inter_modes_info->num = inter_modes_info->num + 1;
                    dVar48 = local_ce0;
                    dVar15 = local_cb0;
                  }
                  *(uint8_t *)(mbmi->enc_quant_dequant_params).quants.y_quant[8] = '\0';
                }
                bVar24 = 0;
                lVar41 = 0x7fffffffffffffff;
                if (dVar15 < dVar48) goto LAB_002183a0;
              }
              else {
                lVar41 = 0x7fffffffffffffff;
                lVar42 = 0x7fffffffffffffff;
                if ((int)local_cb8 == 0) {
LAB_002180ba:
                  pRVar1 = local_cd0;
                  local_ce0 = (double)(ulong)(uint)rd_stats->rate;
                  iVar33 = av1_txfm_search(cpi,x,bsize,rd_stats,local_cd0,rd_stats_uv,rd_stats->rate
                                           ,local_c68);
                  if (iVar33 == 0) {
                    bVar24 = (pRVar1->rate != 0x7fffffff || uVar32 != 0) * '\x03' + 1;
                    lVar41 = 0x7fffffffffffffff;
                  }
                  else {
                    pMVar10 = (x->e_mbd).above_mbmi;
                    uVar26 = 0;
                    uVar34 = 0;
                    if (pMVar10 != (MB_MODE_INFO *)0x0) {
                      uVar34 = (uint)pMVar10->skip_txfm;
                    }
                    pMVar10 = (x->e_mbd).left_mbmi;
                    if (pMVar10 != (MB_MODE_INFO *)0x0) {
                      uVar26 = (uint)pMVar10->skip_txfm;
                    }
                    uVar26 = uVar26 + uVar34;
                    if (rd_stats->skip_txfm == '\0') {
                      iVar33 = (x->mode_costs).skip_txfm_cost[uVar26][0] + local_cd0->rate;
                    }
                    else {
                      iVar33 = (x->mode_costs).skip_txfm_cost[uVar26][1];
                    }
                    iVar9 = x->rdmult;
                    lVar11 = local_cd0->dist;
                    lVar38 = rd_stats->dist * 0x80 +
                             ((long)rd_stats->rate * (long)iVar9 + 0x100 >> 9);
                    if (lVar38 < local_c68) {
                      *ref_skip_rd = lVar42;
                      ref_skip_rd[1] = lVar41;
                      local_c68 = lVar38;
                    }
                    lVar41 = lVar11 * 0x80 +
                             ((long)(iVar33 + local_ce0._0_4_) * (long)iVar9 + 0x100 >> 9);
                    bVar24 = 0;
                    if ((cpi->sf).inter_sf.inter_mode_rd_model_estimation == 1) {
                      lVar42 = rd_stats->dist;
                      lVar11 = rd_stats->sse;
                      lVar38 = lVar11 - lVar42;
                      if ((lVar38 != 0) &&
                         (iVar33 = rd_stats_uv->rate + local_cd0->rate +
                                   (x->mode_costs).skip_txfm_cost[uVar26]
                                   [(byte)(mbmi->enc_quant_dequant_params).quants.y_quant[8][0]],
                         iVar33 != 0)) {
                        BVar7 = *(BLOCK_SIZE *)&mbmi->ppi;
                        if ((BLOCK_16X4 < BVar7) || ((0x30007U >> (BVar7 & 0x1f) & 1) == 0)) {
                          lVar31 = (ulong)BVar7 * 0x70;
                          iVar9 = *(int *)((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x20);
                          bVar24 = 0;
                          if (iVar9 < 0x1900) {
                            dVar48 = (double)lVar38 / (double)iVar33;
                            *(int *)((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x20) =
                                 iVar9 + 1;
                            dVar15 = *(double *)
                                      ((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x30) +
                                     dVar48;
                            dVar17 = *(double *)
                                      ((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x40);
                            dVar16 = *(double *)
                                      ((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x48);
                            auVar13._8_4_ = SUB84(dVar15,0);
                            auVar13._0_8_ =
                                 *(double *)((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x28) +
                                 (double)lVar42;
                            auVar13._12_4_ = (int)((ulong)dVar15 >> 0x20);
                            *(undefined1 (*) [16])
                             ((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x28) = auVar13;
                            dVar15 = (double)lVar11;
                            *(double *)((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x38) =
                                 *(double *)((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x38) +
                                 dVar15;
                            dVar16 = dVar48 * dVar15 + dVar16;
                            auVar14._8_4_ = SUB84(dVar16,0);
                            auVar14._0_8_ = dVar15 * dVar15 + dVar17;
                            auVar14._12_4_ = (int)((ulong)dVar16 >> 0x20);
                            *(undefined1 (*) [16])
                             ((long)(local_c70->tctx).txb_skip_cdf + lVar31 + 0x40) = auVar14;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  ms_params.allow_hp = -1;
                  ms_params._4_4_ = 0x7fffffff;
                  iVar30 = get_sse(cpi,x,(int64_t *)&ms_params);
                  uVar26 = 4;
                  if (((int)local_cb8 < 3) &&
                     (iVar33 = x->qindex * -2 + 0x27e >> 8, uVar26 = iVar33 * 4, iVar33 < 1)) {
                    uVar26 = 4;
                  }
                  lVar11 = *ref_skip_rd;
                  if (((long)(ulong)(x->source_variance <<
                                    ("\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"
                                     [bsize] + 7 & 0x1f)) < lVar11) &&
                     (*(int *)(&DAT_005017f0 + local_cb8 * 4) <= x->qindex)) {
                    uVar26 = uVar26 * *(int *)(&DAT_005017d0 + local_cb8 * 4);
                  }
                  else if ((int)local_cb8 < 2) {
                    uVar26 = (uVar26 >> 1) * 3;
                  }
                  lVar41 = (long)x->rdmult * (long)rd_stats->rate + 0x100 >> 9;
                  lVar42 = iVar30 * 0x80 + lVar41;
                  bVar47 = (int)uVar26 * lVar11 >> 2 < lVar42;
                  if (!bVar47 || lVar11 == 0x7fffffffffffffff) {
                    lVar41 = lVar41 + ms_params._0_8_ * 0x800;
                    goto LAB_002180ba;
                  }
                  bVar24 = (bVar47 && lVar11 != 0x7fffffffffffffff) << 2;
                  lVar41 = 0x7fffffffffffffff;
                }
                if (bVar24 != 0) goto LAB_002183a0;
              }
              if ((local_cf0 == 0x17) || ((uint)local_cf0 == 0xf)) {
                pMVar10 = *(x->e_mbd).mi;
                if ((pMVar10->mode == '\x17') || (pMVar10->mode == '\x0f')) {
                  bVar24 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                           [pMVar10->bsize];
                  if ("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [pMVar10->bsize] <
                      "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                      [pMVar10->bsize]) {
                    bVar24 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                             [pMVar10->bsize];
                  }
                  if (1 < bVar24) {
                    lVar42 = 0;
                    do {
                      if ((x->e_mbd).global_motion[pMVar10->ref_frame[lVar42]].wmtype == '\x01')
                      goto LAB_0021836e;
                    } while (('\0' < pMVar10->ref_frame[1]) &&
                            (bVar47 = lVar42 == 0, lVar42 = lVar42 + 1, bVar47));
                    *(int_interpfilters *)((mbmi->enc_quant_dequant_params).quants.y_quant[0] + 2) =
                         local_c84;
                  }
                }
              }
LAB_0021836e:
              iVar33 = rd_stats->rate;
              lVar42 = rd_stats->dist * 0x80 + ((long)x->rdmult * (long)iVar33 + 0x100 >> 9);
              if (uVar32 == 0) {
                *(long *)((long)(*args->simple_rd)[0] +
                         (long)(char)(mbmi->enc_quant_dequant_params).quants.y_quant[0][0] * 8 +
                         (ulong)(*(ushort *)
                                  ((long)(mbmi->enc_quant_dequant_params).quants.y_quant[9] + 7) &
                                0x30) * 4 + (ulong)((uint)local_cf0 * 0xc0)) = lVar42;
              }
              else {
                bVar24 = 0;
                if (lVar45 <= lVar42) goto LAB_002183a0;
              }
              local_ca8 = (long)iVar33;
              memcpy(&best_mbmi,mbmi,0xb0);
              local_c90 = (ulong)(uint)rd_stats->zero_rate;
              local_bb8 = rd_stats->dist;
              iStack_bb0 = rd_stats->rdcost;
              local_c48 = rd_stats->sse;
              local_c50 = CONCAT71((int7)((ulong)local_c48 >> 8),rd_stats->skip_txfm);
              local_c60._0_3_ = (undefined3)*(undefined4 *)&rd_stats->field_0x21;
              local_c60._3_1_ = (undefined1)*(undefined4 *)&rd_stats->field_0x24;
              uStack_c5c = (undefined3)((uint)*(undefined4 *)&rd_stats->field_0x24 >> 8);
              best_rd_stats_y.skip_txfm = local_cd0->skip_txfm;
              best_rd_stats_y._33_7_ = *(undefined7 *)&local_cd0->field_0x21;
              best_rd_stats_y.rate = local_cd0->rate;
              best_rd_stats_y.zero_rate = local_cd0->zero_rate;
              best_rd_stats_y.dist = local_cd0->dist;
              best_rd_stats_y.rdcost = local_cd0->rdcost;
              best_rd_stats_y.sse = local_cd0->sse;
              local_c80 = tmp_rate_mv;
              *yrd = lVar41;
              if (uVar3 == '\0') {
                best_rd_stats_uv.skip_txfm = rd_stats_uv->skip_txfm;
                best_rd_stats_uv._33_7_ = *(undefined7 *)&rd_stats_uv->field_0x21;
                best_rd_stats_uv.rate = rd_stats_uv->rate;
                best_rd_stats_uv.zero_rate = rd_stats_uv->zero_rate;
                best_rd_stats_uv.dist = rd_stats_uv->dist;
                best_rd_stats_uv.rdcost = rd_stats_uv->rdcost;
                best_rd_stats_uv.sse = rd_stats_uv->sse;
              }
              sVar44 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
              memcpy(best_blk_skip,(x->txfm_search_info).blk_skip,sVar44);
              memcpy(best_tx_type_map,(x->e_mbd).tx_type_map,sVar44);
              local_cc4 = (uint)(byte)(mbmi->enc_quant_dequant_params).quants.y_quant[8][0];
              lVar45 = lVar42;
            }
            bVar24 = 0;
          }
        }
LAB_002183a0:
        uVar26 = local_c7c;
        if ((bVar24 & 3) != 0) break;
      }
      bVar46 = uVar26 <= uVar32;
      bVar47 = uVar32 != uVar26;
      uVar32 = uVar32 + 1;
    } while (bVar47);
    bVar47 = lVar45 == 0x7fffffffffffffff;
    local_ce8 = local_c80;
  }
  pRVar1 = local_cd0;
  iVar33 = (int)local_c90;
  if (!bVar46) {
    return 0x7fffffffffffffff;
  }
  *(char *)((long)(mbmi->enc_quant_dequant_params).quants.y_quant[0] + 1) = cVar4;
  *rate_mv = local_ce8;
  if (bVar47) goto LAB_002186fc;
  pMVar10 = *(x->e_mbd).mi;
  bVar24 = pMVar10->mode;
  if ((bVar24 == 0x13) || (bVar24 == 0x15)) {
    iVar28 = av1_get_ref_mv(x,1);
  }
  else {
    if (bVar24 != 0x18) {
      if ((((bVar24 & 0xfd) != 0x14) && (bVar24 != 0x10)) ||
         (iVar28 = av1_get_ref_mv(x,0), pMVar10->mv[0].as_int != iVar28.as_int)) goto LAB_00218780;
      goto LAB_002186fc;
    }
    iVar27 = av1_get_ref_mv(x,0);
    iVar28 = av1_get_ref_mv(x,1);
    iVar33 = (int)local_c90;
    if (pMVar10->mv[0].as_int == iVar27.as_int) goto LAB_002186fc;
  }
  if (pMVar10->mv[1].as_int != iVar28.as_int) {
LAB_00218780:
    memcpy(mbmi,&best_mbmi,0xb0);
    rd_stats->rate = (int)local_ca8;
    rd_stats->zero_rate = iVar33;
    rd_stats->dist = local_bb8;
    rd_stats->rdcost = iStack_bb0;
    rd_stats->sse = local_c48;
    rd_stats->skip_txfm = (uint8_t)local_c50;
    *(uint *)&rd_stats->field_0x24 = CONCAT31(uStack_c5c,local_c60._3_1_);
    *(undefined4 *)&rd_stats->field_0x21 = local_c60;
    pRVar1->rate = best_rd_stats_y.rate;
    pRVar1->zero_rate = best_rd_stats_y.zero_rate;
    pRVar1->dist = best_rd_stats_y.dist;
    pRVar1->rdcost = best_rd_stats_y.rdcost;
    pRVar1->sse = best_rd_stats_y.sse;
    pRVar1->skip_txfm = best_rd_stats_y.skip_txfm;
    *(undefined7 *)&pRVar1->field_0x21 = best_rd_stats_y._33_7_;
    if (uVar3 == '\0') {
      rd_stats_uv->skip_txfm = best_rd_stats_uv.skip_txfm;
      *(undefined7 *)&rd_stats_uv->field_0x21 = best_rd_stats_uv._33_7_;
      rd_stats_uv->rdcost = best_rd_stats_uv.rdcost;
      rd_stats_uv->sse = best_rd_stats_uv.sse;
      rd_stats_uv->rate = best_rd_stats_uv.rate;
      rd_stats_uv->zero_rate = best_rd_stats_uv.zero_rate;
      rd_stats_uv->dist = best_rd_stats_uv.dist;
    }
    sVar44 = (ulong)(x->e_mbd).width * (ulong)(x->e_mbd).height;
    memcpy((x->txfm_search_info).blk_skip,best_blk_skip,sVar44);
    memcpy((x->e_mbd).tx_type_map,best_tx_type_map,sVar44);
    (x->txfm_search_info).skip_txfm = (uint8_t)local_cc4;
    ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
    ms_params._16_8_ = orig_dst->plane[2];
    ms_params.mv_limits.col_min = orig_dst->stride[0];
    ms_params.mv_limits.col_max = orig_dst->stride[1];
    ms_params._0_8_ = orig_dst->plane[0];
    ms_params.cost_list = (int *)orig_dst->plane[1];
    pmVar19 = (x->e_mbd).plane;
    uVar36 = 0;
    do {
      pbVar37 = &pmVar19->dst;
      pbVar37->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar36 - 8];
      pbVar37->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar36 * 4 + -0x28);
      uVar36 = uVar36 + 1;
      pmVar19 = (macroblockd_plane *)(pbVar37 + 0x51);
    } while ((local_c00 & 0xffffffff) != uVar36);
    return 0;
  }
LAB_002186fc:
  rd_stats->rate = 0x7fffffff;
  rd_stats->zero_rate = 0;
  rd_stats->dist = 0x7fffffffffffffff;
  rd_stats->rdcost = 0x7fffffffffffffff;
  rd_stats->sse = 0x7fffffffffffffff;
  rd_stats->skip_txfm = '\0';
  ms_params.mv_limits._8_8_ = *(undefined8 *)(orig_dst->stride + 2);
  ms_params._16_8_ = orig_dst->plane[2];
  ms_params.mv_limits.col_min = orig_dst->stride[0];
  ms_params.mv_limits.col_max = orig_dst->stride[1];
  ms_params._0_8_ = orig_dst->plane[0];
  ms_params.cost_list = (int *)orig_dst->plane[1];
  pmVar19 = (x->e_mbd).plane;
  uVar36 = 0;
  do {
    pbVar37 = &pmVar19->dst;
    pbVar37->buf = (uint8_t *)ms_params.mv_cost_params.mvcost[uVar36 - 8];
    pbVar37->stride = *(int *)((long)ms_params.mv_cost_params.mvcost + uVar36 * 4 + -0x28);
    uVar36 = uVar36 + 1;
    pmVar19 = (macroblockd_plane *)(pbVar37 + 0x51);
  } while ((local_c00 & 0xffffffff) != uVar36);
  return 0x7fffffffffffffff;
}

Assistant:

static int64_t motion_mode_rd(
    const AV1_COMP *const cpi, TileDataEnc *tile_data, MACROBLOCK *const x,
    BLOCK_SIZE bsize, RD_STATS *rd_stats, RD_STATS *rd_stats_y,
    RD_STATS *rd_stats_uv, HandleInterModeArgs *const args, int64_t ref_best_rd,
    int64_t *ref_skip_rd, int *rate_mv, const BUFFER_SET *orig_dst,
    int64_t *best_est_rd, int do_tx_search, InterModesInfo *inter_modes_info,
    int eval_motion_mode, int64_t *yrd) {
  const AV1_COMMON *const cm = &cpi->common;
  const FeatureFlags *const features = &cm->features;
  TxfmSearchInfo *txfm_info = &x->txfm_search_info;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_comp_pred = has_second_ref(mbmi);
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int rate2_nocoeff = rd_stats->rate;
  int best_xskip_txfm = 0;
  RD_STATS best_rd_stats, best_rd_stats_y, best_rd_stats_uv;
  uint8_t best_blk_skip[MAX_MIB_SIZE * MAX_MIB_SIZE];
  uint8_t best_tx_type_map[MAX_MIB_SIZE * MAX_MIB_SIZE];
  const int rate_mv0 = *rate_mv;
  const int interintra_allowed = cm->seq_params->enable_interintra_compound &&
                                 is_interintra_allowed(mbmi) &&
                                 mbmi->compound_idx;
  WARP_SAMPLE_INFO *const warp_sample_info =
      &x->warp_sample_info[mbmi->ref_frame[0]];
  int *pts0 = warp_sample_info->pts;
  int *pts_inref0 = warp_sample_info->pts_inref;

  assert(mbmi->ref_frame[1] != INTRA_FRAME);
  const MV_REFERENCE_FRAME ref_frame_1 = mbmi->ref_frame[1];
  av1_invalid_rd_stats(&best_rd_stats);
  mbmi->num_proj_ref = 1;  // assume num_proj_ref >=1
  MOTION_MODE last_motion_mode_allowed = SIMPLE_TRANSLATION;
  *yrd = INT64_MAX;
  if (features->switchable_motion_mode) {
    // Determine which motion modes to search if more than SIMPLE_TRANSLATION
    // is allowed.
    last_motion_mode_allowed = motion_mode_allowed(
        xd->global_motion, xd, mbmi, features->allow_warped_motion);
  }

  if (last_motion_mode_allowed == WARPED_CAUSAL) {
    // Collect projection samples used in least squares approximation of
    // the warped motion parameters if WARPED_CAUSAL is going to be searched.
    if (warp_sample_info->num < 0) {
      warp_sample_info->num = av1_findSamples(cm, xd, pts0, pts_inref0);
    }
    mbmi->num_proj_ref = warp_sample_info->num;
  }
  const int total_samples = mbmi->num_proj_ref;
  if (total_samples == 0) {
    // Do not search WARPED_CAUSAL if there are no samples to use to determine
    // warped parameters.
    last_motion_mode_allowed = OBMC_CAUSAL;
  }

  const MB_MODE_INFO base_mbmi = *mbmi;
  MB_MODE_INFO best_mbmi;
  const int interp_filter = features->interp_filter;
  const int switchable_rate =
      av1_is_interp_needed(xd)
          ? av1_get_switchable_rate(x, xd, interp_filter,
                                    cm->seq_params->enable_dual_filter)
          : 0;
  int64_t best_rd = INT64_MAX;
  int best_rate_mv = rate_mv0;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int mode_index_start, mode_index_end;
  const int txfm_rd_gate_level =
      get_txfm_rd_gate_level(cm->seq_params->enable_masked_compound,
                             cpi->sf.inter_sf.txfm_rd_gate_level, bsize,
                             TX_SEARCH_MOTION_MODE, eval_motion_mode);

  // Modify the start and end index according to speed features. For example,
  // if SIMPLE_TRANSLATION has already been searched according to
  // the motion_mode_for_winner_cand speed feature, update the mode_index_start
  // to avoid searching it again.
  update_mode_start_end_index(cpi, mbmi, &mode_index_start, &mode_index_end,
                              last_motion_mode_allowed, interintra_allowed,
                              eval_motion_mode);
  // Main function loop. This loops over all of the possible motion modes and
  // computes RD to determine the best one. This process includes computing
  // any necessary side information for the motion mode and performing the
  // transform search.
  for (int mode_index = mode_index_start; mode_index <= mode_index_end;
       mode_index++) {
    if (args->skip_motion_mode && mode_index) continue;
    int tmp_rate2 = rate2_nocoeff;
    const int is_interintra_mode = mode_index > (int)last_motion_mode_allowed;
    int tmp_rate_mv = rate_mv0;

    *mbmi = base_mbmi;
    if (is_interintra_mode) {
      // Only use SIMPLE_TRANSLATION for interintra
      mbmi->motion_mode = SIMPLE_TRANSLATION;
    } else {
      mbmi->motion_mode = (MOTION_MODE)mode_index;
      assert(mbmi->ref_frame[1] != INTRA_FRAME);
    }

    // Do not search OBMC if the probability of selecting it is below a
    // predetermined threshold for this update_type and block size.
    const FRAME_UPDATE_TYPE update_type =
        get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
    int use_actual_frame_probs = 1;
    int prune_obmc;
#if CONFIG_FPMT_TEST
    use_actual_frame_probs =
        (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 0 : 1;
    if (!use_actual_frame_probs) {
      prune_obmc = cpi->ppi->temp_frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
#endif
    if (use_actual_frame_probs) {
      prune_obmc = cpi->ppi->frame_probs.obmc_probs[update_type][bsize] <
                   cpi->sf.inter_sf.prune_obmc_prob_thresh;
    }
    if ((!cpi->oxcf.motion_mode_cfg.enable_obmc || prune_obmc) &&
        mbmi->motion_mode == OBMC_CAUSAL)
      continue;

    if (mbmi->motion_mode == SIMPLE_TRANSLATION && !is_interintra_mode) {
      // SIMPLE_TRANSLATION mode: no need to recalculate.
      // The prediction is calculated before motion_mode_rd() is called in
      // handle_inter_mode()
    } else if (mbmi->motion_mode == OBMC_CAUSAL) {
      const uint32_t cur_mv = mbmi->mv[0].as_int;
      // OBMC_CAUSAL not allowed for compound prediction
      assert(!is_comp_pred);
      if (have_newmv_in_inter_mode(this_mode)) {
        av1_single_motion_search(cpi, x, bsize, 0, &tmp_rate_mv, INT_MAX, NULL,
                                 &mbmi->mv[0], NULL);
        tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
      }
      if ((mbmi->mv[0].as_int != cur_mv) || eval_motion_mode) {
        // Build the predictor according to the current motion vector if it has
        // not already been built
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, orig_dst, bsize,
                                      0, av1_num_planes(cm) - 1);
      }
      // Build the inter predictor by blending the predictor corresponding to
      // this MV, and the neighboring blocks using the OBMC model
      av1_build_obmc_inter_prediction(
          cm, xd, args->above_pred_buf, args->above_pred_stride,
          args->left_pred_buf, args->left_pred_stride);
#if !CONFIG_REALTIME_ONLY
    } else if (mbmi->motion_mode == WARPED_CAUSAL) {
      int pts[SAMPLES_ARRAY_SIZE], pts_inref[SAMPLES_ARRAY_SIZE];
      mbmi->motion_mode = WARPED_CAUSAL;
      mbmi->wm_params.wmtype = DEFAULT_WMTYPE;
      mbmi->interp_filters =
          av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));

      memcpy(pts, pts0, total_samples * 2 * sizeof(*pts0));
      memcpy(pts_inref, pts_inref0, total_samples * 2 * sizeof(*pts_inref0));
      // Select the samples according to motion vector difference
      if (mbmi->num_proj_ref > 1) {
        mbmi->num_proj_ref = av1_selectSamples(
            &mbmi->mv[0].as_mv, pts, pts_inref, mbmi->num_proj_ref, bsize);
      }

      // Compute the warped motion parameters with a least squares fit
      //  using the collected samples
      if (!av1_find_projection(mbmi->num_proj_ref, pts, pts_inref, bsize,
                               mbmi->mv[0].as_mv.row, mbmi->mv[0].as_mv.col,
                               &mbmi->wm_params, mi_row, mi_col)) {
        assert(!is_comp_pred);
        if (have_newmv_in_inter_mode(this_mode)) {
          // Refine MV for NEWMV mode
          const int_mv mv0 = mbmi->mv[0];
          const WarpedMotionParams wm_params0 = mbmi->wm_params;
          const int num_proj_ref0 = mbmi->num_proj_ref;

          const int_mv ref_mv = av1_get_ref_mv(x, 0);
          SUBPEL_MOTION_SEARCH_PARAMS ms_params;
          av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                            &ref_mv.as_mv, NULL);

          // Refine MV in a small range.
          av1_refine_warped_mv(xd, cm, &ms_params, bsize, pts0, pts_inref0,
                               total_samples, cpi->sf.mv_sf.warp_search_method,
                               cpi->sf.mv_sf.warp_search_iters);

          if (mv0.as_int != mbmi->mv[0].as_int) {
            // Keep the refined MV and WM parameters.
            tmp_rate_mv = av1_mv_bit_cost(
                &mbmi->mv[0].as_mv, &ref_mv.as_mv, x->mv_costs->nmv_joint_cost,
                x->mv_costs->mv_cost_stack, MV_COST_WEIGHT);
            tmp_rate2 = rate2_nocoeff - rate_mv0 + tmp_rate_mv;
          } else {
            // Restore the old MV and WM parameters.
            mbmi->mv[0] = mv0;
            mbmi->wm_params = wm_params0;
            mbmi->num_proj_ref = num_proj_ref0;
          }
        }

        // Build the warped predictor
        av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize, 0,
                                      av1_num_planes(cm) - 1);
      } else {
        continue;
      }
#endif  // !CONFIG_REALTIME_ONLY
    } else if (is_interintra_mode) {
      const int ret =
          av1_handle_inter_intra_mode(cpi, x, bsize, mbmi, args, ref_best_rd,
                                      &tmp_rate_mv, &tmp_rate2, orig_dst);
      if (ret < 0) continue;
    }

    // If we are searching newmv and the mv is the same as refmv, skip the
    // current mode
    if (!av1_check_newmv_joint_nonzero(cm, x)) continue;

    // Update rd_stats for the current motion mode
    txfm_info->skip_txfm = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    rd_stats->skip_txfm = 1;
    rd_stats->rate = tmp_rate2;
    const ModeCosts *mode_costs = &x->mode_costs;
    if (mbmi->motion_mode != WARPED_CAUSAL) rd_stats->rate += switchable_rate;
    if (interintra_allowed) {
      rd_stats->rate +=
          mode_costs->interintra_cost[size_group_lookup[bsize]]
                                     [mbmi->ref_frame[1] == INTRA_FRAME];
    }
    if ((last_motion_mode_allowed > SIMPLE_TRANSLATION) &&
        (mbmi->ref_frame[1] != INTRA_FRAME)) {
      if (last_motion_mode_allowed == WARPED_CAUSAL) {
        rd_stats->rate +=
            mode_costs->motion_mode_cost[bsize][mbmi->motion_mode];
      } else {
        rd_stats->rate +=
            mode_costs->motion_mode_cost1[bsize][mbmi->motion_mode];
      }
    }

    int64_t this_yrd = INT64_MAX;

    if (!do_tx_search) {
      // Avoid doing a transform search here to speed up the overall mode
      // search. It will be done later in the mode search if the current
      // motion mode seems promising.
      int64_t curr_sse = -1;
      int64_t sse_y = -1;
      int est_residue_cost = 0;
      int64_t est_dist = 0;
      int64_t est_rd = 0;
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        curr_sse = get_sse(cpi, x, &sse_y);
        const int has_est_rd = get_est_rate_dist(tile_data, bsize, curr_sse,
                                                 &est_residue_cost, &est_dist);
        (void)has_est_rd;
        assert(has_est_rd);
      } else if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 2 ||
                 cpi->sf.rt_sf.use_nonrd_pick_mode) {
        model_rd_sb_fn[MODELRD_TYPE_MOTION_MODE_RD](
            cpi, bsize, x, xd, 0, num_planes - 1, &est_residue_cost, &est_dist,
            NULL, &curr_sse, NULL, NULL, NULL);
        sse_y = x->pred_sse[xd->mi[0]->ref_frame[0]];
      }
      est_rd = RDCOST(x->rdmult, rd_stats->rate + est_residue_cost, est_dist);
      if (est_rd * 0.80 > *best_est_rd) {
        mbmi->ref_frame[1] = ref_frame_1;
        continue;
      }
      const int mode_rate = rd_stats->rate;
      rd_stats->rate += est_residue_cost;
      rd_stats->dist = est_dist;
      rd_stats->rdcost = est_rd;
      if (rd_stats->rdcost < *best_est_rd) {
        *best_est_rd = rd_stats->rdcost;
        assert(sse_y >= 0);
        ref_skip_rd[1] = txfm_rd_gate_level
                             ? RDCOST(x->rdmult, mode_rate, (sse_y << 4))
                             : INT64_MAX;
      }
      if (cm->current_frame.reference_mode == SINGLE_REFERENCE) {
        if (!is_comp_pred) {
          assert(curr_sse >= 0);
          inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                                rd_stats->rdcost, rd_stats, rd_stats_y,
                                rd_stats_uv, mbmi);
        }
      } else {
        assert(curr_sse >= 0);
        inter_modes_info_push(inter_modes_info, mode_rate, curr_sse,
                              rd_stats->rdcost, rd_stats, rd_stats_y,
                              rd_stats_uv, mbmi);
      }
      mbmi->skip_txfm = 0;
    } else {
      // Perform full transform search
      int64_t skip_rd = INT64_MAX;
      int64_t skip_rdy = INT64_MAX;
      if (txfm_rd_gate_level) {
        // Check if the mode is good enough based on skip RD
        int64_t sse_y = INT64_MAX;
        int64_t curr_sse = get_sse(cpi, x, &sse_y);
        skip_rd = RDCOST(x->rdmult, rd_stats->rate, curr_sse);
        skip_rdy = RDCOST(x->rdmult, rd_stats->rate, (sse_y << 4));
        int eval_txfm = check_txfm_eval(x, bsize, ref_skip_rd[0], skip_rd,
                                        txfm_rd_gate_level, 0);
        if (!eval_txfm) continue;
      }

      // Do transform search
      const int mode_rate = rd_stats->rate;
      if (!av1_txfm_search(cpi, x, bsize, rd_stats, rd_stats_y, rd_stats_uv,
                           rd_stats->rate, ref_best_rd)) {
        if (rd_stats_y->rate == INT_MAX && mode_index == 0) {
          return INT64_MAX;
        }
        continue;
      }
      const int skip_ctx = av1_get_skip_txfm_context(xd);
      const int y_rate =
          rd_stats->skip_txfm
              ? x->mode_costs.skip_txfm_cost[skip_ctx][1]
              : (rd_stats_y->rate + x->mode_costs.skip_txfm_cost[skip_ctx][0]);
      this_yrd = RDCOST(x->rdmult, y_rate + mode_rate, rd_stats_y->dist);

      const int64_t curr_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
      if (curr_rd < ref_best_rd) {
        ref_best_rd = curr_rd;
        ref_skip_rd[0] = skip_rd;
        ref_skip_rd[1] = skip_rdy;
      }
      if (cpi->sf.inter_sf.inter_mode_rd_model_estimation == 1) {
        inter_mode_data_push(
            tile_data, mbmi->bsize, rd_stats->sse, rd_stats->dist,
            rd_stats_y->rate + rd_stats_uv->rate +
                mode_costs->skip_txfm_cost[skip_ctx][mbmi->skip_txfm]);
      }
    }

    if (this_mode == GLOBALMV || this_mode == GLOBAL_GLOBALMV) {
      if (is_nontrans_global_motion(xd, xd->mi[0])) {
        mbmi->interp_filters =
            av1_broadcast_interp_filter(av1_unswitchable_filter(interp_filter));
      }
    }

    const int64_t tmp_rd = RDCOST(x->rdmult, rd_stats->rate, rd_stats->dist);
    if (mode_index == 0) {
      args->simple_rd[this_mode][mbmi->ref_mv_idx][mbmi->ref_frame[0]] = tmp_rd;
    }
    if (mode_index == 0 || tmp_rd < best_rd) {
      // Update best_rd data if this is the best motion mode so far
      best_mbmi = *mbmi;
      best_rd = tmp_rd;
      best_rd_stats = *rd_stats;
      best_rd_stats_y = *rd_stats_y;
      best_rate_mv = tmp_rate_mv;
      *yrd = this_yrd;
      if (num_planes > 1) best_rd_stats_uv = *rd_stats_uv;
      memcpy(best_blk_skip, txfm_info->blk_skip,
             sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
      av1_copy_array(best_tx_type_map, xd->tx_type_map, xd->height * xd->width);
      best_xskip_txfm = mbmi->skip_txfm;
    }
  }
  // Update RD and mbmi stats for selected motion mode
  mbmi->ref_frame[1] = ref_frame_1;
  *rate_mv = best_rate_mv;
  if (best_rd == INT64_MAX || !av1_check_newmv_joint_nonzero(cm, x)) {
    av1_invalid_rd_stats(rd_stats);
    restore_dst_buf(xd, *orig_dst, num_planes);
    return INT64_MAX;
  }
  *mbmi = best_mbmi;
  *rd_stats = best_rd_stats;
  *rd_stats_y = best_rd_stats_y;
  if (num_planes > 1) *rd_stats_uv = best_rd_stats_uv;
  memcpy(txfm_info->blk_skip, best_blk_skip,
         sizeof(txfm_info->blk_skip[0]) * xd->height * xd->width);
  av1_copy_array(xd->tx_type_map, best_tx_type_map, xd->height * xd->width);
  txfm_info->skip_txfm = best_xskip_txfm;

  restore_dst_buf(xd, *orig_dst, num_planes);
  return 0;
}